

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

SlidingWindowsLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_slidingwindows(NeuralNetworkLayer *this)

{
  SlidingWindowsLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x3ed) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3ed;
    this_00 = (SlidingWindowsLayerParams *)operator_new(0x30);
    SlidingWindowsLayerParams::SlidingWindowsLayerParams(this_00);
    (this->layer_).slidingwindows_ = this_00;
  }
  return (SlidingWindowsLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SlidingWindowsLayerParams* NeuralNetworkLayer::mutable_slidingwindows() {
  if (!has_slidingwindows()) {
    clear_layer();
    set_has_slidingwindows();
    layer_.slidingwindows_ = new ::CoreML::Specification::SlidingWindowsLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.slidingWindows)
  return layer_.slidingwindows_;
}